

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O0

int decode_profile_tier_level(GetBitContext *gb,PTLCommon *ptl)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint8_t *puVar7;
  byte bVar8;
  uint local_140;
  uint local_13c;
  uint local_138;
  uint local_134;
  uint local_130;
  int local_12c;
  int i;
  PTLCommon *ptl_local;
  GetBitContext *gb_local;
  uint local_10c;
  uint8_t result_5;
  uint32_t index_5;
  uint local_fc;
  uint8_t result_4;
  uint32_t index_4;
  uint local_ec;
  uint8_t result_3;
  uint32_t index_3;
  uint local_dc;
  uint8_t result_2;
  uint32_t index_2;
  uint local_cc;
  uint8_t result_1;
  uint32_t index_1;
  uint local_bc;
  uint8_t result;
  uint32_t index;
  uint32_t re_cache_1;
  uint8_t *re_buffer_1;
  uint32_t re_size_plus8_1;
  uint32_t re_index_1;
  int tmp_1;
  uint32_t re_cache;
  uint8_t *re_buffer;
  uint32_t re_size_plus8;
  uint32_t re_index;
  int tmp;
  uint32_t re_size_plus8_4;
  uint32_t re_index_4;
  uint32_t re_size_plus8_3;
  uint32_t re_index_3;
  uint32_t re_size_plus8_2;
  uint32_t re_index_2;
  
  if ((int)(gb->size_in_bits - gb->index) < 0x58) {
    gb_local._4_4_ = -1;
  }
  else {
    uVar2 = gb->index;
    local_130 = gb->size_in_bits_plus8;
    puVar7 = gb->buffer;
    uVar3 = *(uint *)(puVar7 + (uVar2 >> 3));
    uVar4 = *(uint *)(puVar7 + (uVar2 >> 3));
    uVar5 = *(uint *)(puVar7 + (uVar2 >> 3));
    uVar6 = *(uint *)(puVar7 + (uVar2 >> 3));
    if (uVar2 + 2 < local_130) {
      local_130 = uVar2 + 2;
    }
    gb->index = local_130;
    ptl->profile_space =
         (byte)(((((uVar3 & 0xff) << 8 | uVar4 >> 8 & 0xff) << 0x10 |
                 (uVar5 >> 0x10 & 0xff) << 8 | uVar6 >> 0x18) << ((byte)uVar2 & 7)) >> 0x1e);
    local_bc = gb->index;
    uVar1 = gb->buffer[local_bc >> 3];
    bVar8 = (byte)local_bc;
    if (gb->index < gb->size_in_bits_plus8) {
      local_bc = local_bc + 1;
    }
    gb->index = local_bc;
    ptl->tier_flag = (uint8_t)((int)(uint)(byte)(uVar1 << (bVar8 & 7)) >> 7);
    uVar2 = gb->index;
    local_134 = gb->size_in_bits_plus8;
    puVar7 = gb->buffer;
    uVar3 = *(uint *)(puVar7 + (uVar2 >> 3));
    uVar4 = *(uint *)(puVar7 + (uVar2 >> 3));
    uVar5 = *(uint *)(puVar7 + (uVar2 >> 3));
    uVar6 = *(uint *)(puVar7 + (uVar2 >> 3));
    if (uVar2 + 5 < local_134) {
      local_134 = uVar2 + 5;
    }
    gb->index = local_134;
    ptl->profile_idc =
         (byte)(((((uVar3 & 0xff) << 8 | uVar4 >> 8 & 0xff) << 0x10 |
                 (uVar5 >> 0x10 & 0xff) << 8 | uVar6 >> 0x18) << ((byte)uVar2 & 7)) >> 0x1b);
    if (ptl->profile_idc == '\x01') {
      fprintf(_stderr,"Main profile bitstream\n");
    }
    else if (ptl->profile_idc == '\x02') {
      fprintf(_stderr,"Main 10 profile bitstream\n");
    }
    else if (ptl->profile_idc == '\x03') {
      fprintf(_stderr,"Main Still Picture profile bitstream\n");
    }
    else if (ptl->profile_idc == '\x04') {
      fprintf(_stderr,"Range Extension profile bitstream\n");
    }
    else {
      fprintf(_stderr,"Unknown HEVC profile: %d\n",(ulong)ptl->profile_idc);
    }
    for (local_12c = 0; local_12c < 0x20; local_12c = local_12c + 1) {
      local_cc = gb->index;
      uVar1 = gb->buffer[local_cc >> 3];
      bVar8 = (byte)local_cc;
      if (gb->index < gb->size_in_bits_plus8) {
        local_cc = local_cc + 1;
      }
      gb->index = local_cc;
      ptl->profile_compatibility_flag[local_12c] =
           (uint8_t)((int)(uint)(byte)(uVar1 << (bVar8 & 7)) >> 7);
      if (((ptl->profile_idc == '\0') && (0 < local_12c)) &&
         (ptl->profile_compatibility_flag[local_12c] != '\0')) {
        ptl->profile_idc = (uint8_t)local_12c;
      }
    }
    local_dc = gb->index;
    uVar1 = gb->buffer[local_dc >> 3];
    bVar8 = (byte)local_dc;
    if (gb->index < gb->size_in_bits_plus8) {
      local_dc = local_dc + 1;
    }
    gb->index = local_dc;
    ptl->progressive_source_flag = (uint8_t)((int)(uint)(byte)(uVar1 << (bVar8 & 7)) >> 7);
    local_ec = gb->index;
    uVar1 = gb->buffer[local_ec >> 3];
    bVar8 = (byte)local_ec;
    if (gb->index < gb->size_in_bits_plus8) {
      local_ec = local_ec + 1;
    }
    gb->index = local_ec;
    ptl->interlaced_source_flag = (uint8_t)((int)(uint)(byte)(uVar1 << (bVar8 & 7)) >> 7);
    local_fc = gb->index;
    uVar1 = gb->buffer[local_fc >> 3];
    bVar8 = (byte)local_fc;
    if (gb->index < gb->size_in_bits_plus8) {
      local_fc = local_fc + 1;
    }
    gb->index = local_fc;
    ptl->non_packed_constraint_flag = (uint8_t)((int)(uint)(byte)(uVar1 << (bVar8 & 7)) >> 7);
    local_10c = gb->index;
    uVar1 = gb->buffer[local_10c >> 3];
    bVar8 = (byte)local_10c;
    if (gb->index < gb->size_in_bits_plus8) {
      local_10c = local_10c + 1;
    }
    gb->index = local_10c;
    ptl->frame_only_constraint_flag = (uint8_t)((int)(uint)(byte)(uVar1 << (bVar8 & 7)) >> 7);
    local_138 = gb->size_in_bits_plus8;
    if (gb->index + 0x10 < local_138) {
      local_138 = gb->index + 0x10;
    }
    gb->index = local_138;
    local_13c = gb->size_in_bits_plus8;
    if (gb->index + 0x10 < local_13c) {
      local_13c = gb->index + 0x10;
    }
    gb->index = local_13c;
    local_140 = gb->size_in_bits_plus8;
    if (gb->index + 0xc < local_140) {
      local_140 = gb->index + 0xc;
    }
    gb->index = local_140;
    gb_local._4_4_ = 0;
  }
  return gb_local._4_4_;
}

Assistant:

static int decode_profile_tier_level(GetBitContext *gb, PTLCommon *ptl)
{
    int i;

    if (get_bits_left(gb) < 2 + 1 + 5 + 32 + 4 + 16 + 16 + 12)
        return -1;
    ptl->profile_space = (uint8_t)get_bits(gb, 2);
    ptl->tier_flag     = (uint8_t)get_bits1(gb);
    ptl->profile_idc   = (uint8_t)get_bits(gb, 5);
    if (ptl->profile_idc == FF_PROFILE_HEVC_MAIN)
        fprintf(stderr, "Main profile bitstream\n");
    else if (ptl->profile_idc == FF_PROFILE_HEVC_MAIN_10)
        fprintf(stderr, "Main 10 profile bitstream\n");
    else if (ptl->profile_idc == FF_PROFILE_HEVC_MAIN_STILL_PICTURE)
        fprintf(stderr, "Main Still Picture profile bitstream\n");
    else if (ptl->profile_idc == FF_PROFILE_HEVC_REXT)
        fprintf(stderr, "Range Extension profile bitstream\n");
    else
        fprintf(stderr, "Unknown HEVC profile: %d\n", ptl->profile_idc);

    for (i = 0; i < 32; i++) {
        ptl->profile_compatibility_flag[i] = (uint8_t)get_bits1(gb);

        if (ptl->profile_idc == 0 && i > 0 && ptl->profile_compatibility_flag[i])
            ptl->profile_idc = (uint8_t)i;
    }
    ptl->progressive_source_flag    = (uint8_t)get_bits1(gb);
    ptl->interlaced_source_flag     = (uint8_t)get_bits1(gb);
    ptl->non_packed_constraint_flag = (uint8_t)get_bits1(gb);
    ptl->frame_only_constraint_flag = (uint8_t)get_bits1(gb);

    skip_bits(gb, 16); // XXX_reserved_zero_44bits[0..15]
    skip_bits(gb, 16); // XXX_reserved_zero_44bits[16..31]
    skip_bits(gb, 12); // XXX_reserved_zero_44bits[32..43]

    return 0;
}